

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::skip_content_with_length(Stream *strm,uint64_t len)

{
  int iVar1;
  unsigned_long *puVar2;
  undefined4 extraout_var;
  unsigned_long local_1038;
  long local_1030;
  ssize_t n;
  size_t read_len;
  uint64_t r;
  char buf [4096];
  uint64_t len_local;
  Stream *strm_local;
  
  read_len = 0;
  buf._4088_8_ = len;
  while( true ) {
    if ((ulong)buf._4088_8_ <= read_len) {
      return;
    }
    n = buf._4088_8_ - read_len;
    local_1038 = 0x1000;
    puVar2 = std::min<unsigned_long>((unsigned_long *)&n,&local_1038);
    iVar1 = (*strm->_vptr_Stream[4])(strm,&r,*puVar2);
    local_1030 = CONCAT44(extraout_var,iVar1);
    if (local_1030 < 1) break;
    read_len = local_1030 + read_len;
  }
  return;
}

Assistant:

inline void skip_content_with_length(Stream &strm, uint64_t len) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];
  uint64_t r = 0;
  while (r < len) {
    auto read_len = static_cast<size_t>(len - r);
    auto n = strm.read(buf, (std::min)(read_len, CPPHTTPLIB_RECV_BUFSIZ));
    if (n <= 0) { return; }
    r += static_cast<uint64_t>(n);
  }
}